

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.h
# Opt level: O3

void __thiscall InvertDatabase::init_buffer(InvertDatabase *this,int num_class,int size)

{
  element_type *peVar1;
  int *piVar2;
  ulong uVar3;
  bool print_idlist;
  Itemset_S tmp;
  bool local_4e;
  undefined1 local_4d;
  int local_4c [3];
  value_type local_40;
  
  local_4c[2] = num_class;
  std::vector<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>::reserve
            (&this->_items,(long)size);
  local_4e = ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             print_tidlist != '\0';
  if (0 < size) {
    uVar3 = 0;
    do {
      local_4c[1] = 1;
      local_4c[0] = 0;
      local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Itemset,std::allocator<Itemset>,int,int,int&,bool&>
                (&local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Itemset **)&local_40,(allocator<Itemset> *)&local_4d,local_4c + 1,local_4c,
                 local_4c + 2,&local_4e);
      peVar1 = ((((local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->theArray
               ).
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      piVar2 = *(int **)&peVar1->super__Vector_base<int,_std::allocator<int>_>;
      if (*(pointer *)((long)&peVar1->super__Vector_base<int,_std::allocator<int>_> + 8) == piVar2)
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      *piVar2 = (this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3];
      std::vector<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>::push_back
                (&this->_items,&local_40);
      if (local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)size != uVar3);
  }
  return;
}

Assistant:

void init_buffer(int num_class, int size) {
        _items.reserve(size);
        bool print_idlist = args->print_tidlist;

        for (int i = 0; i < size; i++) {
            Itemset_S tmp = make_shared<Itemset>(1, 0, num_class, print_idlist);
            tmp->setitem(0, backidx[i]);
            _items.push_back(tmp);
        }
    }